

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O2

string * __thiscall
Lodtalk::VMContext::getClassNameOfObject_abi_cxx11_
          (string *__return_storage_ptr__,VMContext *this,Oop object)

{
  int classIndex;
  Oop this_00;
  string local_30;
  
  classIndex = classIndexOf(object);
  this_00 = getClassFromIndex(this,classIndex);
  if ((uint)((ulong)*(undefined8 *)this_00.field_0 >> 0x2a) == 0xc) {
    if (*(Class **)((long)this_00.field_0 + 0x40) == (Class *)&NilObject) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"a Metaclass",(allocator *)&local_30);
    }
    else {
      Class::getNameString_abi_cxx11_(&local_30,*(Class **)((long)this_00.field_0 + 0x40));
      std::operator+(__return_storage_ptr__,&local_30," class");
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  else {
    Class::getNameString_abi_cxx11_(__return_storage_ptr__,(Class *)this_00.field_0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VMContext::getClassNameOfObject(Oop object)
{
	auto classIndex = classIndexOf(object);
	auto classOop = getClassFromIndex(classIndex);
	if(classOop.header->classIndex == SCI_Metaclass)
    {
        auto meta = reinterpret_cast<Metaclass*> (classOop.pointer);
        if(!meta->thisClass.isNil())
        {
            auto clazz = reinterpret_cast<Class*> (meta->thisClass.pointer);
    		return clazz->getNameString() + " class";
        }

        return "a Metaclass";
    }

	auto clazz = reinterpret_cast<Class*> (classOop.pointer);
	return clazz->getNameString();
}